

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DependenceGraph.cpp
# Opt level: O0

void __thiscall dg::sdg::DGArgumentPair::DGArgumentPair(DGArgumentPair *this,DGParameters *p)

{
  DGParameters *in_RSI;
  DGNodeArgument *in_RDI;
  DependenceGraph *g;
  DependenceGraph *in_stack_ffffffffffffffe8;
  
  DGParameters::getDG(in_RSI);
  DGElement::DGElement
            ((DGElement *)in_RSI,in_stack_ffffffffffffffe8,(DGElementType)((ulong)in_RDI >> 0x20));
  (in_RDI->super_DGNode).super_DepDGElement.super_DGElement._vptr_DGElement =
       (_func_int **)&PTR__DGArgumentPair_0010fcc0;
  *(DGParameters **)
   &(in_RDI->super_DGNode).super_DepDGElement._use_deps.
    super_DGContainer<dg::sdg::DepDGElement_*,_4U>.container._M_t._M_impl = in_RSI;
  g = (DependenceGraph *)
      ((long)&(in_RDI->super_DGNode).super_DepDGElement._use_deps.
              super_DGContainer<dg::sdg::DepDGElement_*,_4U>.container._M_t._M_impl + 8);
  DGParameters::getDG(in_RSI);
  DGNodeArgument::DGNodeArgument(in_RDI,g);
  DGParameters::getDG(in_RSI);
  DGNodeArgument::DGNodeArgument(in_RDI,g);
  return;
}

Assistant:

DGArgumentPair::DGArgumentPair(DGParameters &p)
        : DGElement(p.getDG(), DGElementType::ARG_PAIR), _parameters(p),
          _input(p.getDG()), _output(p.getDG()) {}